

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall luna::CodeGenerateVisitor::LeaveLoop(CodeGenerateVisitor *this)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  pointer pLVar4;
  CodeGenerateVisitor *in_RDI;
  Instruction *i;
  int diff;
  iterator it;
  list<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_> *loop_jumps;
  LoopInfo *loop;
  int end_index;
  Function *function;
  list<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_> *in_stack_ffffffffffffff78;
  Function *this_00;
  const_iterator __position;
  iterator local_58;
  _List_const_iterator<luna::LoopJumpInfo> local_50;
  Instruction *local_48;
  int local_3c;
  _Self local_38;
  _Self local_30;
  _List_node_base *local_28;
  LoopInfo *local_20;
  int local_14;
  Function *local_10;
  
  local_10 = GetCurrentFunction(in_RDI);
  sVar3 = Function::OpCodeSize((Function *)0x1b7dd0);
  local_14 = (int)sVar3;
  local_20 = &in_RDI->current_function_->current_block_->current_loop_;
  if (local_20->loop_ast_ != (SyntaxTree *)0x0) {
    local_28 = (_List_node_base *)&in_RDI->current_function_->loop_jumps_;
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>::begin
                   (in_stack_ffffffffffffff78);
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::list<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>::end
                     (in_stack_ffffffffffffff78);
      bVar2 = std::operator!=(&local_30,&local_38);
      if (!bVar2) break;
      pLVar4 = std::_List_iterator<luna::LoopJumpInfo>::operator->
                         ((_List_iterator<luna::LoopJumpInfo> *)0x1b7e4e);
      if (pLVar4->loop_ast_ == local_20->loop_ast_) {
        local_3c = 0;
        pLVar4 = std::_List_iterator<luna::LoopJumpInfo>::operator->
                           ((_List_iterator<luna::LoopJumpInfo> *)0x1b7e71);
        if (pLVar4->jump_type_ == JumpHead) {
          iVar1 = local_20->start_index_;
          pLVar4 = std::_List_iterator<luna::LoopJumpInfo>::operator->
                             ((_List_iterator<luna::LoopJumpInfo> *)0x1b7e8d);
          local_3c = iVar1 - pLVar4->instruction_index_;
        }
        else {
          pLVar4 = std::_List_iterator<luna::LoopJumpInfo>::operator->
                             ((_List_iterator<luna::LoopJumpInfo> *)0x1b7ea7);
          iVar1 = local_14;
          if (pLVar4->jump_type_ == JumpTail) {
            pLVar4 = std::_List_iterator<luna::LoopJumpInfo>::operator->
                               ((_List_iterator<luna::LoopJumpInfo> *)0x1b7ebf);
            local_3c = iVar1 - pLVar4->instruction_index_;
          }
        }
        this_00 = local_10;
        std::_List_iterator<luna::LoopJumpInfo>::operator->
                  ((_List_iterator<luna::LoopJumpInfo> *)0x1b7ee3);
        local_48 = Function::GetMutableInstruction(this_00,(size_t)in_stack_ffffffffffffff78);
        Instruction::RefillsBx(local_48,(short)local_3c);
        __position._M_node = local_28;
        local_58._M_node =
             (_List_node_base *)std::_List_iterator<luna::LoopJumpInfo>::operator++(&local_30,0);
        std::_List_const_iterator<luna::LoopJumpInfo>::_List_const_iterator(&local_50,&local_58);
        std::__cxx11::list<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>::erase
                  ((list<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_> *)this_00,
                   __position);
      }
      else {
        std::_List_iterator<luna::LoopJumpInfo>::operator++(&local_30);
      }
    }
  }
  return;
}

Assistant:

void LeaveLoop()
        {
            auto function = GetCurrentFunction();
            // Instruction index after loop
            int end_index = function->OpCodeSize();

            auto &loop = current_function_->current_block_->current_loop_;
            if (loop.loop_ast_)
            {
                auto &loop_jumps = current_function_->loop_jumps_;
                auto it = loop_jumps.begin();
                while (it != loop_jumps.end())
                {
                    if (it->loop_ast_ == loop.loop_ast_)
                    {
                        // Calculate diff between current index with index of destination
                        int diff = 0;
                        if (it->jump_type_ == LoopJumpInfo::JumpHead)
                            diff = loop.start_index_ - it->instruction_index_;
                        else if (it->jump_type_ == LoopJumpInfo::JumpTail)
                            diff = end_index - it->instruction_index_;

                        // Get instruction and refill its jump diff
                        auto i = function->GetMutableInstruction(it->instruction_index_);
                        i->RefillsBx(diff);

                        // Remove it from loop_jumps when it refilled
                        loop_jumps.erase(it++);
                    }
                    else
                        ++it;
                }
            }
        }